

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::std_table(sequence *__return_storage_ptr__,spec *s)

{
  void *pvVar1;
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  uchar local_ba [2];
  character_either local_b8;
  key local_98;
  either local_70;
  repeat_at_least local_50;
  character local_38;
  
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00539820;
  local_38.value_ = '[';
  local_b8.super_scanner_base._vptr_scanner_base._0_2_ = 0x920;
  cs._M_len = 2;
  cs._M_array = (iterator)&local_b8;
  character_either::character_either((character_either *)&local_98,cs);
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00539a98;
  local_50.length_ = 0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_50.other_,(character_either *)&local_98);
  if (local_98.scanner_.super_scanner_base._vptr_scanner_base != (_func_int **)0x0) {
    operator_delete(local_98.scanner_.super_scanner_base._vptr_scanner_base,
                    (long)local_98.scanner_.others_.
                          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.scanner_.super_scanner_base._vptr_scanner_base);
  }
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__key_0053a810;
  dotted_key((sequence *)&local_b8,s);
  simple_key(&local_70,s);
  either::either<toml::detail::sequence,toml::detail::either>
            (&local_98.scanner_,(sequence *)&local_b8,&local_70);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &local_b8.chars_);
  local_ba[0] = ' ';
  local_ba[1] = '\t';
  cs_00._M_len = 2;
  cs_00._M_array = local_ba;
  character_either::character_either(&local_b8,cs_00);
  local_70.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00539a98;
  local_70.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            ((scanner_storage *)
             &local_70.others_.
              super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
  pvVar1 = (void *)CONCAT71(local_b8.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_b8.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b8.chars_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  local_b8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00539820;
  local_b8.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0x5d;
  sequence::
  sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::syntax::key,toml::detail::repeat_at_least,toml::detail::character>
            (__return_storage_ptr__,&local_38,&local_50,&local_98,(repeat_at_least *)&local_70,
             (character *)&local_b8);
  if (local_70.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (**(code **)((long)((local_70.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_98.scanner_.others_);
  if (local_50.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_50.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence std_table(const spec& s)
{
    return sequence(character('['), ws(s), key(s), ws(s), character(']'));
}